

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::SliceParameter::SerializeWithCachedSizes(SliceParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  uint32 uVar2;
  int iVar3;
  int32 value;
  UnknownFieldSet *unknown_fields;
  int local_40;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SliceParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    uVar2 = slice_dim(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar2,output);
  }
  local_40 = 0;
  iVar3 = slice_point_size(this);
  for (; local_40 < iVar3; local_40 = local_40 + 1) {
    uVar2 = slice_point(this,local_40);
    google::protobuf::internal::WireFormatLite::WriteUInt32(2,uVar2,output);
  }
  if ((uVar1 & 2) != 0) {
    value = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,value,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SliceParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void SliceParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.SliceParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 slice_dim = 1 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->slice_dim(), output);
  }

  // repeated uint32 slice_point = 2;
  for (int i = 0, n = this->slice_point_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      2, this->slice_point(i), output);
  }

  // optional int32 axis = 3 [default = 1];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->axis(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.SliceParameter)
}